

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_group_test.cpp
# Opt level: O2

void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail(void)

{
  uint __line;
  __type _Var1;
  long lVar2;
  char *__assertion;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool a3Called;
  bool a2Called;
  allocator<char> local_289;
  Argengine ae;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"a1",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"a3",(allocator<char> *)&local_200);
  __l._M_len = 2;
  __l._M_array = &error;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,__l,(allocator_type *)&local_220);
  juzzlin::Argengine::Argengine(&ae,&local_140,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  a2Called = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"a2",(allocator<char> *)&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"--",(allocator<char> *)&local_220);
  std::operator+(&local_260,&local_240,"a2");
  __l_00._M_len = 2;
  __l_00._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_48,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_1e0,(allocator_type *)&local_160);
  local_1a0._8_8_ = 0;
  local_1a0._M_unused._M_object = &a2Called;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp:99:50)>
              ::_M_invoke;
  local_190 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp:99:50)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"",(allocator<char> *)&local_180);
  juzzlin::Argengine::addOption(&ae,&local_48,&local_1a0,0,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_48);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&local_240);
  a3Called = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"a3",(allocator<char> *)&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"--",(allocator<char> *)&local_220);
  std::operator+(&local_260,&local_240,"a3");
  __l_01._M_len = 2;
  __l_01._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_78,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_1e0,(allocator_type *)&local_160);
  local_1c0._8_8_ = 0;
  local_1c0._M_unused._M_object = &a3Called;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp:103:50)>
              ::_M_invoke;
  local_1b0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp:103:50)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"",(allocator<char> *)&local_180);
  juzzlin::Argengine::addOption(&ae,&local_78,&local_1c0,0,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"a2",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"a3",(allocator<char> *)&local_200);
  __l_02._M_len = 2;
  __l_02._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_a8,__l_02,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_220,(allocator_type *)&local_1e0);
  juzzlin::Argengine::addOptionGroup(&ae,&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a8);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&error._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  juzzlin::Argengine::parse();
  if (a2Called == true) {
    __assertion = "!a2Called";
    __line = 0x71;
  }
  else if (a3Called == true) {
    __assertion = "!a3Called";
    __line = 0x72;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Argengine",&local_289);
    std::operator+(&local_108,&local_128,": These options must coexist: \'");
    std::operator+(&local_180,&local_108,"a2");
    std::operator+(&local_160,&local_180,"\', \'");
    std::operator+(&local_1e0,&local_160,"a3");
    std::operator+(&local_220,&local_1e0,"\'. Missing options: \'");
    std::operator+(&local_200,&local_220,"a2");
    std::operator+(&local_240,&local_200,"\'.");
    _Var1 = std::operator==(&error,&local_240);
    if (_Var1) {
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&error);
      juzzlin::Argengine::~Argengine(&ae);
      return;
    }
    __assertion = 
    "error == std::string(name) + \": These options must coexist: \'\" + a2 + \"\', \'\" + a3 + \"\'. Missing options: \'\" + a2 + \"\'.\""
    ;
    __line = 0x73;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/option_group_test/option_group_test.cpp"
                ,__line,"void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()");
}

Assistant:

void testOptionGroup_optionMissing_shouldNotReferToVariants_shouldFail()
{
    const auto a1 = "a1";
    const auto a2 = "a2";
    const auto a3 = "a3";
    Argengine ae({ a1, a3 });
    bool a2Called {};
    ae.addOption({ a2, std::string("--") + a2 }, [&] {
        a2Called = true;
    });
    bool a3Called {};
    ae.addOption({ a3, std::string("--") + a3 }, [&] {
        a3Called = true;
    });
    ae.addOptionGroup({ a2, a3 });
    std::string error;
    try {
        ae.parse();
    } catch (std::runtime_error & e) {
        error = e.what();
    }
    assert(!a2Called);
    assert(!a3Called);
    assert(error == std::string(name) + ": These options must coexist: '" + a2 + "', '" + a3 + "'. Missing options: '" + a2 + "'.");
}